

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall chrono::ChFile_ps_axis_setting::InitializeDefaults(ChFile_ps_axis_setting *this)

{
  this->axis = true;
  (this->axis_color).r = 0.5;
  (this->axis_color).g = 0.5;
  (this->axis_color).b = 0.5;
  this->axis_width = 0.02;
  this->ticks = true;
  this->ticks_step = 0.1;
  this->ticks_width = 0.04;
  SetLabel(this," ");
  (this->label_color).b = 0.0;
  (this->label_color).r = 0.0;
  (this->label_color).g = 0.0;
  this->label_fontsize = 0.32;
  this->label_fontname = 0;
  this->numbers = true;
  (this->numbers_color).b = 0.0;
  (this->numbers_color).r = 0.0;
  (this->numbers_color).g = 0.0;
  this->numbers_fontsize = 0.2;
  this->min = 0.0;
  this->max = 1.0;
  return;
}

Assistant:

void ChFile_ps_axis_setting::InitializeDefaults() {
    axis = true;
    axis_color.SetGray(.5);
    axis_width = 0.02;
    ticks = true;
    ticks_step = 0.1;
    ticks_width = 0.04;
    SetLabel((char*)" ");
    label_color.SetGray(.0);
    label_fontsize = 0.32;
    label_fontname = 0;
    numbers = true;
    numbers_color.SetGray(.0);
    numbers_fontsize = 0.20;
    min = 0;
    max = 1;
}